

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O1

FMFieldList max_field_lists(FMFieldList list1,FMFieldList list2)

{
  FMFieldList p_Var1;
  undefined8 uVar2;
  size_t s;
  char **ppcVar3;
  int iVar4;
  long lVar5;
  undefined8 *__dest;
  FMFieldList p_Var6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  undefined8 *puVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  size_t __nmemb;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  
  lVar5 = -0x100000000;
  lVar14 = 1;
  lVar16 = -0x100000000;
  p_Var6 = list1;
  do {
    lVar16 = lVar16 + 0x100000000;
    lVar14 = lVar14 + -1;
    ppcVar3 = &p_Var6->field_name;
    p_Var6 = p_Var6 + 1;
  } while (*ppcVar3 != (char *)0x0);
  uVar13 = 0xffffffffffffffff;
  p_Var6 = list2;
  do {
    uVar13 = uVar13 + 1;
    lVar16 = lVar16 + 0x100000000;
    lVar5 = lVar5 + 0x100000000;
    ppcVar3 = &p_Var6->field_name;
    p_Var6 = p_Var6 + 1;
  } while (*ppcVar3 != (char *)0x0);
  s = (lVar5 >> 0x1d) * 3;
  __dest = (undefined8 *)ffs_malloc(s);
  memcpy(__dest,list2,s);
  p_Var6 = (FMFieldList)ffs_malloc((lVar16 >> 0x1d) * 3);
  uVar12 = (uint)uVar13;
  if (lVar14 == 0) {
    uVar11 = 0;
  }
  else {
    uVar9 = 1;
    if (1 < (int)uVar12) {
      uVar9 = uVar13 & 0xffffffff;
    }
    uVar7 = 1;
    if (1 < -(int)lVar14) {
      uVar7 = (ulong)(uint)-(int)lVar14;
    }
    uVar11 = 0;
    do {
      p_Var1 = list1 + uVar11;
      uVar15 = 0;
      if (uVar13 != 0) {
        uVar17 = 0;
        puVar10 = __dest;
        do {
          if (((char *)*puVar10 != (char *)0x0) &&
             (iVar4 = strcmp(p_Var1->field_name,(char *)*puVar10), uVar18 = uVar17, iVar4 == 0))
          break;
          uVar17 = uVar17 + 1;
          puVar10 = puVar10 + 3;
          uVar18 = uVar9;
        } while (uVar9 != uVar17);
        uVar15 = (uint)uVar18;
      }
      if (uVar15 == uVar12) {
        pcVar8 = strdup(p_Var1->field_name);
        p_Var6[uVar11].field_name = pcVar8;
        pcVar8 = strdup(p_Var1->field_type);
        p_Var6[uVar11].field_type = pcVar8;
        iVar4 = p_Var1->field_offset;
        p_Var6[uVar11].field_size = p_Var1->field_size;
        p_Var6[uVar11].field_offset = iVar4;
      }
      else {
        iVar4 = field_type_eq(p_Var1->field_type,(char *)__dest[(ulong)uVar15 * 3 + 1]);
        if (iVar4 == 0) {
          free(__dest);
          free(p_Var6);
          return (FMFieldList)0x0;
        }
        pcVar8 = strdup(p_Var1->field_name);
        p_Var6[uVar11].field_name = pcVar8;
        pcVar8 = strdup(p_Var1->field_type);
        p_Var6[uVar11].field_type = pcVar8;
        iVar4 = *(int *)(__dest + (ulong)uVar15 * 3 + 2);
        if (iVar4 < p_Var1->field_size) {
          iVar4 = p_Var1->field_size;
        }
        p_Var6[uVar11].field_size = iVar4;
        p_Var6[uVar11].field_offset = p_Var1->field_offset;
        __dest[(ulong)uVar15 * 3] = 0;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar7);
  }
  uVar15 = (uint)uVar11;
  if (uVar13 != 0) {
    uVar9 = 1;
    if (1 < (int)uVar12) {
      uVar9 = uVar13 & 0xffffffff;
    }
    lVar5 = 0;
    do {
      if (*(char **)((long)__dest + lVar5) != (char *)0x0) {
        pcVar8 = strdup(*(char **)((long)__dest + lVar5));
        iVar4 = (int)uVar11;
        p_Var6[iVar4].field_name = pcVar8;
        pcVar8 = strdup(*(char **)((long)__dest + lVar5 + 8));
        p_Var6[iVar4].field_type = pcVar8;
        uVar2 = *(undefined8 *)((long)__dest + lVar5 + 0x10);
        p_Var6[iVar4].field_size = (int)uVar2;
        p_Var6[iVar4].field_offset = (int)((ulong)uVar2 >> 0x20);
        uVar11 = (ulong)(iVar4 + 1);
      }
      uVar15 = (uint)uVar11;
      lVar5 = lVar5 + 0x18;
    } while (uVar9 * 0x18 != lVar5);
  }
  free(__dest);
  __nmemb = (size_t)(int)uVar15;
  p_Var6[__nmemb].field_name = (char *)0x0;
  p_Var6[__nmemb].field_type = (char *)0x0;
  p_Var6[__nmemb].field_size = 0;
  p_Var6[__nmemb].field_offset = 0;
  lVar5 = 0x18;
  qsort(p_Var6,__nmemb,0x18,field_offset_compar);
  if (1 < (int)uVar15) {
    do {
      iVar4 = *(int *)((long)p_Var6 + lVar5 + -8) + *(int *)((long)p_Var6 + lVar5 + -4);
      if (*(int *)((long)&p_Var6->field_offset + lVar5) < iVar4) {
        *(int *)((long)&p_Var6->field_offset + lVar5) = iVar4;
      }
      lVar5 = lVar5 + 0x18;
    } while ((ulong)uVar15 * 0x18 != lVar5);
  }
  return p_Var6;
}

Assistant:

extern
FMFieldList
max_field_lists(FMFieldList list1, FMFieldList list2)
{
    FMFieldList max_field_list = NULL;
    FMFieldList tlist2;
    int field_count1 = count_FMfield(list1);
    int field_count2 = count_FMfield(list2);
    int max_field_count = 0;
    int i, j;

    /* make a copy of list2 that we can scratch on */
    tlist2 = (FMFieldList) malloc((size_t) sizeof(FMField) * field_count2);
    memcpy(tlist2, list2, sizeof(FMField) * field_count2);

    max_field_list = (FMFieldList) malloc((size_t) sizeof(FMField) *
				      (field_count1 + field_count2 + 1));

    for (i = 0; i < field_count1; i++) {
	/* for each field in list1 */
	for (j = 0; j < field_count2; j++) {
	    if (tlist2[j].field_name &&
	      (strcmp(list1[i].field_name, tlist2[j].field_name) == 0)) {
		break;
	    }
	}
	if (j == field_count2) {
	    /* field exists only in 1, use it as is */
	    max_field_list[max_field_count].field_name =
		strdup(list1[i].field_name);
	    max_field_list[max_field_count].field_type =
		strdup(list1[i].field_type);
	    max_field_list[max_field_count].field_size =
		list1[i].field_size;
	    max_field_list[max_field_count].field_offset =
		list1[i].field_offset;
	    max_field_count++;
	} else {
	    /* field list in both.  Check types and take max size */
	    if (!field_type_eq(list1[i].field_type, tlist2[j].field_type)) {
		/* Yikes!  Types are bad!  Serious problem */
		free(tlist2);
		free(max_field_list);
		return NULL;
	    }
	    max_field_list[max_field_count].field_name =
		strdup(list1[i].field_name);
	    max_field_list[max_field_count].field_type =
		strdup(list1[i].field_type);
	    max_field_list[max_field_count].field_size =
		Max(list1[i].field_size, tlist2[j].field_size);
	    /* tentative offset */
	    max_field_list[max_field_count].field_offset =
		list1[i].field_offset;
	    max_field_count++;
	    /* mark field in list 2 as used */
	    tlist2[j].field_name = NULL;
	}
    }
    for (j = 0; j < field_count2; j++) {
	if (tlist2[j].field_name != NULL) {
	    /* didn't mark this field as used.  Must only be in list2 */
	    max_field_list[max_field_count].field_name =
		strdup(tlist2[j].field_name);
	    max_field_list[max_field_count].field_type =
		strdup(tlist2[j].field_type);
	    max_field_list[max_field_count].field_size =
		tlist2[j].field_size;
	    max_field_list[max_field_count].field_offset =
		tlist2[j].field_offset;
	    max_field_count++;
	}
    }
    free(tlist2);

    max_field_list[max_field_count].field_name = NULL;
    max_field_list[max_field_count].field_type = NULL;
    max_field_list[max_field_count].field_size = 0;
    max_field_list[max_field_count].field_offset = 0;

    /* sort the max list by offset now */
    qsort(max_field_list, max_field_count, sizeof(FMField),
	  field_offset_compar);
    for (i = 1; i < max_field_count; i++) {
	int last_field_end = max_field_list[i - 1].field_offset +
	max_field_list[i - 1].field_size;
	if (max_field_list[i].field_offset < last_field_end) {
	    /* damn, got some overlap.  Push this field up to fix. */
	    max_field_list[i].field_offset = last_field_end;
	}
    }
    return max_field_list;
}